

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O2

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset)

{
  uint new_num_strips;
  size_type __n;
  pointer piVar1;
  int iVar2;
  size_t j;
  size_type sVar3;
  ulong uVar4;
  pointer __src;
  unsigned_long __n2;
  long lVar5;
  allocator_type local_71;
  Data2D<int> *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  size_t local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> dad;
  
  __n = mset->num_dimensions;
  new_num_strips = mset->cache_num_indexes;
  Data2D<int>::Data2D<int,int>(__return_storage_ptr__,(int)__n,new_num_strips);
  local_60 = __n * 4;
  if ((int)new_num_strips < 1) {
    new_num_strips = 0;
  }
  local_58 = (ulong)new_num_strips;
  local_68 = &__return_storage_ptr__->vec;
  uVar4 = 0;
  local_70 = __return_storage_ptr__;
  while (uVar4 != local_58) {
    __src = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + mset->num_dimensions * uVar4;
    ::std::vector<int,_std::allocator<int>_>::vector(&dad,__n,&local_71);
    if (__n != 0) {
      memmove(dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start,__src,local_60);
    }
    lVar5 = local_70->stride * uVar4;
    piVar1 = (local_70->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_50 = uVar4;
    for (sVar3 = 0; sVar3 != __n; sVar3 = sVar3 + 1) {
      if (dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [sVar3] == 0) {
        piVar1[lVar5 + sVar3] = -1;
      }
      else {
        dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [sVar3] = (dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_start[sVar3] + -1) / 2;
        iVar2 = MultiIndexSet::getSlot
                          (mset,dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        while( true ) {
          piVar1[lVar5 + sVar3] = iVar2;
          if ((iVar2 != -1) ||
             (dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[sVar3] == 0)) break;
          dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [sVar3] = (dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar3] + -1) / 2;
          iVar2 = MultiIndexSet::getSlot
                            (mset,dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
        }
        dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [sVar3] = __src[sVar3];
      }
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dad.super__Vector_base<int,_std::allocator<int>_>);
    uVar4 = local_50 + 1;
  }
  return local_70;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] >= level0_offset){
                    int current = p[j];
                    dad[j] = RuleLocal::getParent<effrule>(current);
                    pp[2*j] = mset.getSlot(dad);
                    while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                        current = dad[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                    }
                    dad[j] = RuleLocal::getStepParent<effrule>(current);
                    if (dad[j] != -1){
                        pp[2*j + 1] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] == 0){
                    pp[j] = -1;
                }else{
                    dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                    pp[j] = mset.getSlot(dad.data());
                    while((dad[j] != 0) && (pp[j] == -1)){
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }
}